

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  ImVec2 IVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ImVec2 size_expected;
  ImVec2 local_30;
  undefined1 local_28 [16];
  undefined1 extraout_var [56];
  
  auVar2._8_8_ = 0;
  auVar2._0_4_ = corner_target->x;
  auVar2._4_4_ = corner_target->y;
  IVar1 = window->Pos;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = IVar1.x;
  auVar4._4_4_ = IVar1.y;
  auVar4 = vsubps_avx(auVar4,auVar2);
  auVar6._8_8_ = 0;
  auVar6._0_4_ = corner_norm->x;
  auVar6._4_4_ = corner_norm->y;
  local_28 = vfmadd213ps_fma(auVar4,auVar6,auVar2);
  auVar5._0_4_ = IVar1.x + (window->Size).x;
  auVar5._4_4_ = IVar1.y + (window->Size).y;
  auVar5._8_8_ = 0;
  auVar4 = vsubps_avx(auVar2,auVar5);
  auVar4 = vfmadd213ps_fma(auVar4,auVar6,auVar5);
  auVar4 = vsubps_avx(auVar4,local_28);
  local_30 = (ImVec2)vmovlps_avx(auVar4);
  auVar3._0_8_ = CalcWindowSizeAfterConstraint(window,&local_30);
  auVar3._8_56_ = extraout_var;
  IVar1 = (ImVec2)vmovlps_avx(local_28);
  *out_pos = IVar1;
  if ((corner_norm->x == 0.0) && (!NAN(corner_norm->x))) {
    out_pos->x = out_pos->x - (auVar3._0_4_ - local_30.x);
  }
  if ((corner_norm->y == 0.0) && (!NAN(corner_norm->y))) {
    auVar4 = vmovshdup_avx(auVar3._0_16_);
    out_pos->y = out_pos->y - (auVar4._0_4_ - local_30.y);
  }
  IVar1 = (ImVec2)vmovlps_avx(auVar3._0_16_);
  *out_size = IVar1;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}